

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O1

void __thiscall QRollEffect::run(QRollEffect *this,int time)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar3;
  ulong uVar4;
  Data *pDVar7;
  int iVar8;
  undefined4 *puVar9;
  int iVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  QSize local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->widget).wp.d;
  if (((pDVar7 != (Data *)0x0) && (*(int *)(pDVar7 + 4) != 0)) &&
     ((this->widget).wp.value != (QObject *)0x0)) {
    this->duration = time;
    this->elapsed = 0;
    if (time < 0) {
      uVar1 = this->totalHeight;
      uVar5 = this->totalWidth;
      uVar2 = this->currentHeight;
      uVar6 = this->currentWidth;
      iVar8 = (int)((~-(uint)((this->orientation & 3U) == 0) & uVar5 - uVar6) +
                   (~-(uint)((this->orientation & 0xcU) == 0) & uVar1 - uVar2)) / 3;
      iVar10 = 0x32;
      if (0x32 < iVar8) {
        iVar10 = iVar8;
      }
      iVar8 = 0x78;
      if (iVar10 < 0x78) {
        iVar8 = iVar10;
      }
      this->duration = iVar8;
    }
    local_60 = scroll;
    local_58 = (ImplFn)0x0;
    local_48 = (QSize)QTimer::timeout;
    local_40 = 0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QRollEffect::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = scroll;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_50,(void **)&this->anim,(QObject *)&local_48,(void **)this,
               (QSlotObjectBase *)&local_60,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_48.ht.m_i = *(int *)(*(long *)((this->widget).wp.value + 0x20) + 0x18);
    local_48.wd.m_i = *(int *)(*(long *)((this->widget).wp.value + 0x20) + 0x14);
    QWidget::move(&this->super_QWidget,(QPoint *)&local_48);
    uVar3._0_4_ = this->currentHeight;
    uVar3._4_4_ = this->currentWidth;
    uVar4._0_4_ = this->totalHeight;
    uVar4._4_4_ = this->totalWidth;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar4;
    auVar13._0_8_ =
         CONCAT44(-(uint)((int)uVar3._4_4_ < (int)uVar4._4_4_),
                  -(uint)((int)(undefined4)uVar3 < (int)(undefined4)uVar4));
    auVar13._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar3 & auVar13._0_8_;
    auVar11 = ~auVar13 & auVar12 | auVar11;
    local_48.ht.m_i = auVar11._0_4_;
    local_48.wd.m_i = auVar11._4_4_;
    QWidget::resize(&this->super_QWidget,&local_48);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_ExplicitShowHide,true);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_Hidden,false);
    QWidget::show(&this->super_QWidget);
    QWidget::setEnabled(&this->super_QWidget,false);
    this->done = false;
    this->showWidget = true;
    QTimer::start((int)&this->anim);
    QElapsedTimer::start();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRollEffect::run(int time)
{
    if (!widget)
        return;

    duration  = time;
    elapsed = 0;

    if (duration < 0) {
        int dist = 0;
        if (orientation & (RightScroll|LeftScroll))
            dist += totalWidth - currentWidth;
        if (orientation & (DownScroll|UpScroll))
            dist += totalHeight - currentHeight;
        duration = qMin(qMax(dist/3, 50), 120);
    }

    connect(&anim, &QTimer::timeout, this, &QRollEffect::scroll);

    move(widget->geometry().x(),widget->geometry().y());
    resize(qMin(currentWidth, totalWidth), qMin(currentHeight, totalHeight));

    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    show();
    setEnabled(false);

    showWidget = true;
    done = false;
    anim.start(1);
    checkTime.start();
}